

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobal(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  undefined8 in_RAX;
  GlobalType local_8;
  
  local_8._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_8.mutable_ = mutable_;
  local_8.type.enum_ = type.enum_;
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::emplace_back<wabt::SharedValidator::GlobalType>(&this->globals_,&local_8);
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnGlobal(const Location& loc,
                                 Type type,
                                 bool mutable_) {
  globals_.push_back(GlobalType{type, mutable_});
  return Result::Ok;
}